

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.h
# Opt level: O2

void __thiscall cmComputeLinkDepends::LinkEntry::LinkEntry(LinkEntry *this)

{
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_48.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_48.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_48);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            (&this->Item,&local_30,(cmListFileBacktrace *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_30);
  this->Target = (cmGeneratorTarget *)0x0;
  this->Kind = Library;
  std::__cxx11::string::string((string *)&this->Feature,(string *)&DEFAULT_abi_cxx11_);
  return;
}

Assistant:

LinkEntry() = default;